

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseImport
          (Parser *this,
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *dependency,RepeatedField<int> *public_dependency,RepeatedField<int> *weak_dependency,
          LocationRecorder *root_location)

{
  Location *pLVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  Token *token;
  undefined1 local_78 [8];
  LocationRecorder location_2;
  LocationRecorder location_1;
  undefined1 local_48 [8];
  LocationRecorder location;
  LocationRecorder *root_location_local;
  RepeatedField<int> *weak_dependency_local;
  RepeatedField<int> *public_dependency_local;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *dependency_local;
  Parser *this_local;
  
  location.location_ = (Location *)root_location;
  bVar2 = Consume(this,"import");
  if (!bVar2) {
    this_local._7_1_ = 0;
    goto LAB_00355377;
  }
  bVar2 = LookingAt(this,"public");
  pLVar1 = location.location_;
  if (bVar2) {
    iVar3 = RepeatedField<int>::size(public_dependency);
    LocationRecorder::LocationRecorder
              ((LocationRecorder *)local_48,(LocationRecorder *)pLVar1,10,iVar3);
    bVar2 = Consume(this,"public");
    if (bVar2) {
      iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size(dependency);
      piVar4 = RepeatedField<int>::Add(public_dependency);
      *piVar4 = iVar3;
    }
    else {
      this_local._7_1_ = 0;
    }
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_48);
joined_r0x00355176:
    if (!bVar2) goto LAB_00355377;
  }
  else {
    bVar2 = LookingAt(this,"weak");
    pLVar1 = location.location_;
    if (bVar2) {
      iVar3 = RepeatedField<int>::size(weak_dependency);
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)&location_2.location_,(LocationRecorder *)pLVar1,0xb,iVar3);
      bVar2 = Consume(this,"weak");
      if (bVar2) {
        iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::size(dependency);
        piVar4 = RepeatedField<int>::Add(weak_dependency);
        *piVar4 = iVar3;
      }
      else {
        this_local._7_1_ = 0;
      }
      LocationRecorder::~LocationRecorder((LocationRecorder *)&location_2.location_);
      goto joined_r0x00355176;
    }
  }
  pLVar1 = location.location_;
  iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(dependency);
  LocationRecorder::LocationRecorder
            ((LocationRecorder *)local_78,(LocationRecorder *)pLVar1,3,iVar3);
  output = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add(dependency);
  bVar2 = ConsumeString(this,output,"Expected a string naming the file to import.");
  if (bVar2) {
    token = io::Tokenizer::previous(this->input_);
    LocationRecorder::EndAt((LocationRecorder *)local_78,token);
    bVar2 = ConsumeEndOfDeclaration(this,";",(LocationRecorder *)local_78);
    if (bVar2) {
      bVar2 = false;
    }
    else {
      this_local._7_1_ = 0;
      bVar2 = true;
    }
  }
  else {
    this_local._7_1_ = 0;
    bVar2 = true;
  }
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_78);
  if (!bVar2) {
    this_local._7_1_ = 1;
  }
LAB_00355377:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseImport(RepeatedPtrField<string>* dependency,
                         RepeatedField<int32>* public_dependency,
                         RepeatedField<int32>* weak_dependency,
                         const LocationRecorder& root_location) {
  DO(Consume("import"));
  if (LookingAt("public")) {
    LocationRecorder location(
        root_location, FileDescriptorProto::kPublicDependencyFieldNumber,
        public_dependency->size());
    DO(Consume("public"));
    *public_dependency->Add() = dependency->size();
  } else if (LookingAt("weak")) {
    LocationRecorder location(
        root_location, FileDescriptorProto::kWeakDependencyFieldNumber,
        weak_dependency->size());
    DO(Consume("weak"));
    *weak_dependency->Add() = dependency->size();
  }
  {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kDependencyFieldNumber,
                              dependency->size());
    DO(ConsumeString(dependency->Add(),
      "Expected a string naming the file to import."));

    location.EndAt(input_->previous());

    DO(ConsumeEndOfDeclaration(";", &location));
  }
  return true;
}